

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slapack_lite.c
# Opt level: O3

int spotf2_(char *uplo,integer *n,real *a,integer *lda,integer *info)

{
  int iVar1;
  int iVar2;
  logical lVar3;
  integer iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  real *prVar8;
  doublereal dVar9;
  integer i__2;
  int local_54;
  real r__1;
  integer i__3;
  double local_48;
  integer *local_40;
  real *local_38;
  
  iVar1 = *lda;
  *info = 0;
  spotf2_::upper = lsame_(uplo,"U");
  if ((spotf2_::upper == 0) && (lVar3 = lsame_(uplo,"L"), lVar3 == 0)) {
    iVar6 = -1;
  }
  else {
    iVar2 = *n;
    if (iVar2 < 0) {
      iVar6 = -2;
    }
    else {
      iVar6 = -4;
      if ((int)(iVar2 + (uint)(iVar2 == 0)) <= *lda) {
        iVar6 = *info;
        if (iVar6 == 0) {
          if (iVar2 == 0) {
            return 0;
          }
          uVar5 = ~(long)iVar1;
          local_40 = info;
          if (spotf2_::upper == 0) {
            spotf2_::j = 1;
            local_54 = iVar1 + 1;
            while( true ) {
              i__2 = spotf2_::j + -1;
              local_48 = (double)a[uVar5 + (long)(spotf2_::j * local_54)];
              dVar9 = sdot_(&i__2,a + uVar5 + (long)(spotf2_::j + iVar1),lda,
                            a + uVar5 + (long)(spotf2_::j + iVar1),lda);
              spotf2_::ajj = (real)(local_48 - dVar9);
              if (spotf2_::ajj <= 0.0) break;
              if (spotf2_::ajj < 0.0) {
                spotf2_::ajj = sqrtf(spotf2_::ajj);
              }
              else {
                spotf2_::ajj = SQRT(spotf2_::ajj);
              }
              iVar4 = spotf2_::j;
              a[uVar5 + (long)(spotf2_::j * local_54)] = spotf2_::ajj;
              i__2 = *n - iVar4;
              if (i__2 != 0 && iVar4 <= *n) {
                i__3 = iVar4 + -1;
                sgemv_("No transpose",&i__2,&i__3,&c_b181,a + uVar5 + (long)(iVar4 + iVar1 + 1),lda,
                       a + uVar5 + (long)(iVar4 + iVar1),lda,&c_b164,
                       a + uVar5 + (long)(iVar4 + iVar4 * iVar1 + 1),&c__1);
                i__2 = *n - spotf2_::j;
                r__1 = 1.0 / spotf2_::ajj;
                sscal_(&i__2,&r__1,a + uVar5 + (long)(spotf2_::j * iVar1 + spotf2_::j + 1),&c__1);
                iVar4 = spotf2_::j;
              }
              spotf2_::j = iVar4 + 1;
              if (iVar2 <= iVar4) {
                return 0;
              }
            }
          }
          else {
            prVar8 = a + uVar5 + 1;
            spotf2_::j = 1;
            local_54 = iVar1 + 1;
            local_38 = prVar8;
            while( true ) {
              i__2 = spotf2_::j + -1;
              local_48 = (double)a[uVar5 + (long)(spotf2_::j + spotf2_::j * iVar1)];
              dVar9 = sdot_(&i__2,prVar8 + spotf2_::j * iVar1,&c__1,prVar8 + spotf2_::j * iVar1,
                            &c__1);
              spotf2_::ajj = (real)(local_48 - dVar9);
              if (spotf2_::ajj <= 0.0) break;
              if (spotf2_::ajj < 0.0) {
                spotf2_::ajj = sqrtf(spotf2_::ajj);
              }
              else {
                spotf2_::ajj = SQRT(spotf2_::ajj);
              }
              iVar4 = spotf2_::j;
              a[uVar5 + (long)(spotf2_::j * local_54)] = spotf2_::ajj;
              iVar6 = *n - iVar4;
              if (iVar6 != 0 && iVar4 <= *n) {
                i__2 = iVar4 + -1;
                iVar7 = (iVar4 + 1) * iVar1;
                i__3 = iVar6;
                sgemv_("Transpose",&i__2,&i__3,&c_b181,prVar8 + iVar7,lda,prVar8 + iVar4 * iVar1,
                       &c__1,&c_b164,a + uVar5 + (long)(iVar7 + iVar4),lda);
                prVar8 = local_38;
                i__2 = *n - spotf2_::j;
                r__1 = 1.0 / spotf2_::ajj;
                sscal_(&i__2,&r__1,a + uVar5 + (long)((spotf2_::j + 1) * iVar1 + spotf2_::j),lda);
                iVar4 = spotf2_::j;
              }
              spotf2_::j = iVar4 + 1;
              if (iVar2 <= iVar4) {
                return 0;
              }
            }
          }
          iVar4 = spotf2_::j;
          a[uVar5 + (long)(local_54 * spotf2_::j)] = spotf2_::ajj;
          *local_40 = iVar4;
          return 0;
        }
        goto LAB_00116e0f;
      }
    }
  }
  *info = iVar6;
LAB_00116e0f:
  i__2 = -iVar6;
  xerbla_("SPOTF2",&i__2);
  return 0;
}

Assistant:

int spotf2_(char *uplo, integer *n, real *a, integer *lda,
	integer *info)
{
    /* System generated locals */
    integer a_dim1, a_offset, i__1, i__2, i__3;
    real r__1;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    static integer j;
    static real ajj;
    extern doublereal sdot_(integer *, real *, integer *, real *, integer *);
    extern logical lsame_(char *, char *);
    extern /* Subroutine */ int sscal_(integer *, real *, real *, integer *),
	    sgemv_(char *, integer *, integer *, real *, real *, integer *,
	    real *, integer *, real *, real *, integer *);
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    -- LAPACK routine (version 3.0) --
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,
       Courant Institute, Argonne National Lab, and Rice University
       February 29, 1992


    Purpose
    =======

    SPOTF2 computes the Cholesky factorization of a real symmetric
    positive definite matrix A.

    The factorization has the form
       A = U' * U ,  if UPLO = 'U', or
       A = L  * L',  if UPLO = 'L',
    where U is an upper triangular matrix and L is lower triangular.

    This is the unblocked version of the algorithm, calling Level 2 BLAS.

    Arguments
    =========

    UPLO    (input) CHARACTER*1
            Specifies whether the upper or lower triangular part of the
            symmetric matrix A is stored.
            = 'U':  Upper triangular
            = 'L':  Lower triangular

    N       (input) INTEGER
            The order of the matrix A.  N >= 0.

    A       (input/output) REAL array, dimension (LDA,N)
            On entry, the symmetric matrix A.  If UPLO = 'U', the leading
            n by n upper triangular part of A contains the upper
            triangular part of the matrix A, and the strictly lower
            triangular part of A is not referenced.  If UPLO = 'L', the
            leading n by n lower triangular part of A contains the lower
            triangular part of the matrix A, and the strictly upper
            triangular part of A is not referenced.

            On exit, if INFO = 0, the factor U or L from the Cholesky
            factorization A = U'*U  or A = L*L'.

    LDA     (input) INTEGER
            The leading dimension of the array A.  LDA >= max(1,N).

    INFO    (output) INTEGER
            = 0: successful exit
            < 0: if INFO = -k, the k-th argument had an illegal value
            > 0: if INFO = k, the leading minor of order k is not
                 positive definite, and the factorization could not be
                 completed.

    =====================================================================


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;

    /* Function Body */
    *info = 0;
    upper = lsame_(uplo, "U");
    if (! upper && ! lsame_(uplo, "L")) {
	*info = -1;
    } else if (*n < 0) {
	*info = -2;
    } else if (*lda < max(1,*n)) {
	*info = -4;
    }
    if (*info != 0) {
	i__1 = -(*info);
	xerbla_("SPOTF2", &i__1);
	return 0;
    }

/*     Quick return if possible */

    if (*n == 0) {
	return 0;
    }

    if (upper) {

/*        Compute the Cholesky factorization A = U'*U. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {

/*           Compute U(J,J) and test for non-positive-definiteness. */

	    i__2 = j - 1;
	    ajj = a[j + j * a_dim1] - sdot_(&i__2, &a[j * a_dim1 + 1], &c__1,
		    &a[j * a_dim1 + 1], &c__1);
	    if (ajj <= 0.f) {
		a[j + j * a_dim1] = ajj;
		goto L30;
	    }
	    ajj = sqrt(ajj);
	    a[j + j * a_dim1] = ajj;

/*           Compute elements J+1:N of row J. */

	    if (j < *n) {
		i__2 = j - 1;
		i__3 = *n - j;
		sgemv_("Transpose", &i__2, &i__3, &c_b181, &a[(j + 1) *
			a_dim1 + 1], lda, &a[j * a_dim1 + 1], &c__1, &c_b164,
			&a[j + (j + 1) * a_dim1], lda);
		i__2 = *n - j;
		r__1 = 1.f / ajj;
		sscal_(&i__2, &r__1, &a[j + (j + 1) * a_dim1], lda);
	    }
/* L10: */
	}
    } else {

/*        Compute the Cholesky factorization A = L*L'. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {

/*           Compute L(J,J) and test for non-positive-definiteness. */

	    i__2 = j - 1;
	    ajj = a[j + j * a_dim1] - sdot_(&i__2, &a[j + a_dim1], lda, &a[j
		    + a_dim1], lda);
	    if (ajj <= 0.f) {
		a[j + j * a_dim1] = ajj;
		goto L30;
	    }
	    ajj = sqrt(ajj);
	    a[j + j * a_dim1] = ajj;

/*           Compute elements J+1:N of column J. */

	    if (j < *n) {
		i__2 = *n - j;
		i__3 = j - 1;
		sgemv_("No transpose", &i__2, &i__3, &c_b181, &a[j + 1 +
			a_dim1], lda, &a[j + a_dim1], lda, &c_b164, &a[j + 1
			+ j * a_dim1], &c__1);
		i__2 = *n - j;
		r__1 = 1.f / ajj;
		sscal_(&i__2, &r__1, &a[j + 1 + j * a_dim1], &c__1);
	    }
/* L20: */
	}
    }
    goto L40;

L30:
    *info = j;

L40:
    return 0;

/*     End of SPOTF2 */

}